

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Parms * __thiscall embree::XMLLoader::loadMaterialParms(XMLLoader *this,Ref<embree::XML> *parms)

{
  XMLLoader *pXVar1;
  bool bVar2;
  undefined1 uVar3;
  size_t sVar4;
  runtime_error *this_00;
  long *in_RDX;
  Parms *in_RDI;
  string type;
  string name;
  Ref<embree::XML> entry;
  size_t i;
  Parms *material;
  undefined4 in_stack_fffffffffffff558;
  float in_stack_fffffffffffff55c;
  Variant *in_stack_fffffffffffff560;
  string *in_stack_fffffffffffff568;
  Variant *in_stack_fffffffffffff570;
  XMLLoader *in_stack_fffffffffffff5a0;
  undefined7 in_stack_fffffffffffff5a8;
  undefined1 in_stack_fffffffffffff5af;
  XMLLoader *in_stack_fffffffffffff5b0;
  undefined7 in_stack_fffffffffffff5b8;
  undefined1 in_stack_fffffffffffff5bf;
  undefined7 in_stack_fffffffffffff5c8;
  undefined1 in_stack_fffffffffffff5cf;
  XMLLoader *in_stack_fffffffffffff5d0;
  undefined7 in_stack_fffffffffffff5d8;
  undefined1 in_stack_fffffffffffff5df;
  XMLLoader *in_stack_fffffffffffff5e0;
  undefined7 in_stack_fffffffffffff608;
  string local_920 [520];
  Ref<embree::XML> *in_stack_fffffffffffff8e8;
  XMLLoader *in_stack_fffffffffffff8f0;
  allocator local_569;
  string local_568 [32];
  string local_548 [1071];
  allocator local_119;
  string local_118 [32];
  string local_f8 [32];
  XMLLoader *local_d8 [4];
  undefined1 local_b1;
  long *local_b0;
  long *local_98;
  long *local_90;
  string *local_88;
  const_reference local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  string *local_30;
  string *local_28;
  string *local_20;
  string *local_18;
  string *local_10;
  string *local_8;
  
  local_b1 = 0;
  local_b0 = in_RDX;
  Parms::Parms((Parms *)0x385c0f);
  local_d8[3] = (XMLLoader *)0x0;
  do {
    pXVar1 = local_d8[3];
    local_90 = local_b0;
    sVar4 = XML::size((XML *)0x385c5b);
    if (sVar4 <= pXVar1) {
      return in_RDI;
    }
    local_98 = local_b0;
    local_78 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
               operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                           *)(*local_b0 + 0x80),(size_type)local_d8[3]);
    local_70 = (string *)local_d8;
    local_d8[0] = (XMLLoader *)local_78->ptr;
    if (local_d8[0] != (XMLLoader *)0x0) {
      (*(*(_func_int ***)&(local_d8[0]->path).filename)[2])();
    }
    local_8 = (string *)local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"name",&local_119);
    XML::parm((XML *)CONCAT17(in_stack_fffffffffffff5af,in_stack_fffffffffffff5a8),
              (string *)in_stack_fffffffffffff5a0);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    local_10 = (string *)local_d8;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff560,
                            (char *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    if (bVar2) {
      load<int>((XMLLoader *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8),
                (Ref<embree::XML> *)in_stack_fffffffffffff5b0);
      Variant::Variant(in_stack_fffffffffffff560,(int)in_stack_fffffffffffff55c);
      Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                 in_stack_fffffffffffff560);
      Variant::~Variant(in_stack_fffffffffffff560);
    }
    else {
      local_18 = (string *)local_d8;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff560,
                              (char *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558))
      ;
      if (bVar2) {
        load<embree::Vec2<int>>
                  (in_stack_fffffffffffff5d0,
                   (Ref<embree::XML> *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8)
                  );
        Variant::Variant(in_stack_fffffffffffff570,(Vec2i *)in_stack_fffffffffffff568);
        Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                   in_stack_fffffffffffff560);
        Variant::~Variant(in_stack_fffffffffffff560);
      }
      else {
        local_20 = (string *)local_d8;
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff560,
                                (char *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558
                                                ));
        if (bVar2) {
          load<embree::Vec3<int>>
                    (in_stack_fffffffffffff5e0,
                     (Ref<embree::XML> *)
                     CONCAT17(in_stack_fffffffffffff5df,in_stack_fffffffffffff5d8));
          Variant::Variant(in_stack_fffffffffffff570,(Vec3i *)in_stack_fffffffffffff568);
          Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                     in_stack_fffffffffffff560);
          Variant::~Variant(in_stack_fffffffffffff560);
        }
        else {
          local_28 = (string *)local_d8;
          uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff560,
                                  (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                   in_stack_fffffffffffff558));
          if ((bool)uVar3) {
            load<embree::Vec4<int>>
                      (in_stack_fffffffffffff5e0,
                       (Ref<embree::XML> *)
                       CONCAT17(in_stack_fffffffffffff5df,in_stack_fffffffffffff5d8));
            Variant::Variant(in_stack_fffffffffffff570,(Vec4i *)in_stack_fffffffffffff568);
            Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                       in_stack_fffffffffffff560);
            Variant::~Variant(in_stack_fffffffffffff560);
          }
          else {
            local_30 = (string *)local_d8;
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff560,
                                    (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                     in_stack_fffffffffffff558));
            if (bVar2) {
              load<float>((XMLLoader *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8)
                          ,(Ref<embree::XML> *)in_stack_fffffffffffff5b0);
              Variant::Variant(in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
              Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                         in_stack_fffffffffffff560);
              Variant::~Variant(in_stack_fffffffffffff560);
            }
            else {
              local_38 = (string *)local_d8;
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff560,
                                      (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                       in_stack_fffffffffffff558));
              if (bVar2) {
                load<embree::Vec2<float>>
                          (in_stack_fffffffffffff5d0,
                           (Ref<embree::XML> *)
                           CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8));
                Variant::Variant(in_stack_fffffffffffff570,(Vec2f *)in_stack_fffffffffffff568);
                Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                           in_stack_fffffffffffff560);
                Variant::~Variant(in_stack_fffffffffffff560);
              }
              else {
                local_40 = (string *)local_d8;
                in_stack_fffffffffffff5e0 = local_d8[0];
                in_stack_fffffffffffff5df =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff560,
                                     (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                      in_stack_fffffffffffff558));
                if ((bool)in_stack_fffffffffffff5df) {
                  load<embree::Vec3<float>>
                            (in_stack_fffffffffffff5e0,
                             (Ref<embree::XML> *)
                             CONCAT17(in_stack_fffffffffffff5df,in_stack_fffffffffffff5d8));
                  Variant::Variant(in_stack_fffffffffffff570,(Vec3f *)in_stack_fffffffffffff568);
                  Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                             in_stack_fffffffffffff560);
                  Variant::~Variant(in_stack_fffffffffffff560);
                }
                else {
                  local_48 = (string *)local_d8;
                  in_stack_fffffffffffff5d0 = local_d8[0];
                  in_stack_fffffffffffff5cf =
                       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff560,
                                       (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                        in_stack_fffffffffffff558));
                  if ((bool)in_stack_fffffffffffff5cf) {
                    load<embree::Vec4<float>>
                              (in_stack_fffffffffffff5e0,
                               (Ref<embree::XML> *)
                               CONCAT17(in_stack_fffffffffffff5df,in_stack_fffffffffffff5d8));
                    Variant::Variant(in_stack_fffffffffffff570,(Vec4f *)in_stack_fffffffffffff568);
                    Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                               in_stack_fffffffffffff560);
                    Variant::~Variant(in_stack_fffffffffffff560);
                  }
                  else {
                    local_50 = (string *)local_d8;
                    in_stack_fffffffffffff5bf =
                         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff560,
                                         (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                          in_stack_fffffffffffff558));
                    if ((bool)in_stack_fffffffffffff5bf) {
                      loadTextureParm(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
                      Variant::Variant(in_stack_fffffffffffff560,
                                       (shared_ptr<embree::Texture> *)
                                       CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558)
                                      );
                      Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                                 in_stack_fffffffffffff560);
                      Variant::~Variant(in_stack_fffffffffffff560);
                      std::shared_ptr<embree::Texture>::~shared_ptr
                                ((shared_ptr<embree::Texture> *)0x3865d0);
                    }
                    else {
                      local_58 = (string *)local_d8;
                      in_stack_fffffffffffff5b0 = local_d8[0];
                      in_stack_fffffffffffff5af =
                           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)in_stack_fffffffffffff560,
                                           (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                            in_stack_fffffffffffff558));
                      if ((bool)in_stack_fffffffffffff5af) {
                        local_60 = (string *)local_d8;
                        in_stack_fffffffffffff5a0 = local_d8[0];
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_568,"type",&local_569);
                        XML::parm((XML *)CONCAT17(in_stack_fffffffffffff5af,
                                                  in_stack_fffffffffffff5a8),
                                  (string *)in_stack_fffffffffffff5a0);
                        std::__cxx11::string::~string(local_568);
                        std::allocator<char>::~allocator((allocator<char> *)&local_569);
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_fffffffffffff560,
                                                (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                                 in_stack_fffffffffffff558));
                        if (bVar2) {
                          load<int>((XMLLoader *)
                                    CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8),
                                    (Ref<embree::XML> *)in_stack_fffffffffffff5b0);
                          Variant::Variant(in_stack_fffffffffffff560,(int)in_stack_fffffffffffff55c)
                          ;
                          Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                                     in_stack_fffffffffffff560);
                          Variant::~Variant(in_stack_fffffffffffff560);
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff560,
                                                  (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                                   in_stack_fffffffffffff558));
                          if (bVar2) {
                            load<embree::Vec2<int>>
                                      (in_stack_fffffffffffff5d0,
                                       (Ref<embree::XML> *)
                                       CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8)
                                      );
                            Variant::Variant(in_stack_fffffffffffff570,
                                             (Vec2i *)in_stack_fffffffffffff568);
                            Parms::add((Parms *)in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                                       in_stack_fffffffffffff560);
                            Variant::~Variant(in_stack_fffffffffffff560);
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff560,
                                                  (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                                   in_stack_fffffffffffff558));
                            if (bVar2) {
                              load<embree::Vec3<int>>
                                        (in_stack_fffffffffffff5e0,
                                         (Ref<embree::XML> *)
                                         CONCAT17(in_stack_fffffffffffff5df,
                                                  in_stack_fffffffffffff5d8));
                              Variant::Variant(in_stack_fffffffffffff570,
                                               (Vec3i *)in_stack_fffffffffffff568);
                              Parms::add((Parms *)in_stack_fffffffffffff570,
                                         in_stack_fffffffffffff568,in_stack_fffffffffffff560);
                              Variant::~Variant(in_stack_fffffffffffff560);
                            }
                            else {
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff560,
                                                  (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                                   in_stack_fffffffffffff558));
                              if (bVar2) {
                                load<embree::Vec4<int>>
                                          (in_stack_fffffffffffff5e0,
                                           (Ref<embree::XML> *)
                                           CONCAT17(in_stack_fffffffffffff5df,
                                                    in_stack_fffffffffffff5d8));
                                Variant::Variant(in_stack_fffffffffffff570,
                                                 (Vec4i *)in_stack_fffffffffffff568);
                                Parms::add((Parms *)in_stack_fffffffffffff570,
                                           in_stack_fffffffffffff568,in_stack_fffffffffffff560);
                                Variant::~Variant(in_stack_fffffffffffff560);
                              }
                              else {
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff560,
                                                  (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                                   in_stack_fffffffffffff558));
                                if (bVar2) {
                                  load<float>((XMLLoader *)
                                              CONCAT17(in_stack_fffffffffffff5bf,
                                                       in_stack_fffffffffffff5b8),
                                              (Ref<embree::XML> *)in_stack_fffffffffffff5b0);
                                  Variant::Variant(in_stack_fffffffffffff560,
                                                   in_stack_fffffffffffff55c);
                                  Parms::add((Parms *)in_stack_fffffffffffff570,
                                             in_stack_fffffffffffff568,in_stack_fffffffffffff560);
                                  Variant::~Variant(in_stack_fffffffffffff560);
                                }
                                else {
                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff560,
                                                  (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                                   in_stack_fffffffffffff558));
                                  if (bVar2) {
                                    load<embree::Vec2<float>>
                                              (in_stack_fffffffffffff5d0,
                                               (Ref<embree::XML> *)
                                               CONCAT17(in_stack_fffffffffffff5cf,
                                                        in_stack_fffffffffffff5c8));
                                    Variant::Variant(in_stack_fffffffffffff570,
                                                     (Vec2f *)in_stack_fffffffffffff568);
                                    Parms::add((Parms *)in_stack_fffffffffffff570,
                                               in_stack_fffffffffffff568,in_stack_fffffffffffff560);
                                    Variant::~Variant(in_stack_fffffffffffff560);
                                  }
                                  else {
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff560,
                                                  (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                                   in_stack_fffffffffffff558));
                                    if (bVar2) {
                                      load<embree::Vec3<float>>
                                                (in_stack_fffffffffffff5e0,
                                                 (Ref<embree::XML> *)
                                                 CONCAT17(in_stack_fffffffffffff5df,
                                                          in_stack_fffffffffffff5d8));
                                      Variant::Variant(in_stack_fffffffffffff570,
                                                       (Vec3f *)in_stack_fffffffffffff568);
                                      Parms::add((Parms *)in_stack_fffffffffffff570,
                                                 in_stack_fffffffffffff568,in_stack_fffffffffffff560
                                                );
                                      Variant::~Variant(in_stack_fffffffffffff560);
                                    }
                                    else {
                                      bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff560,
                                                  (char *)CONCAT44(in_stack_fffffffffffff55c,
                                                                   in_stack_fffffffffffff558));
                                      if (!bVar2) {
                                        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                                        local_68 = (string *)local_d8;
                                        ParseLocation::str_abi_cxx11_
                                                  ((ParseLocation *)
                                                   CONCAT17(uVar3,in_stack_fffffffffffff608));
                                        std::operator+(in_stack_fffffffffffff568,
                                                       (char *)in_stack_fffffffffffff560);
                                        std::operator+(in_stack_fffffffffffff568,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff560);
                                        std::runtime_error::runtime_error(this_00,local_920);
                                        __cxa_throw(this_00,&std::runtime_error::typeinfo,
                                                    std::runtime_error::~runtime_error);
                                      }
                                      load<embree::Vec4<float>>
                                                (in_stack_fffffffffffff5e0,
                                                 (Ref<embree::XML> *)
                                                 CONCAT17(in_stack_fffffffffffff5df,
                                                          in_stack_fffffffffffff5d8));
                                      Variant::Variant(in_stack_fffffffffffff570,
                                                       (Vec4f *)in_stack_fffffffffffff568);
                                      Parms::add((Parms *)in_stack_fffffffffffff570,
                                                 in_stack_fffffffffffff568,in_stack_fffffffffffff560
                                                );
                                      Variant::~Variant(in_stack_fffffffffffff560);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        std::__cxx11::string::~string(local_548);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_f8);
    in_stack_fffffffffffff568 = (string *)local_d8;
    local_88 = in_stack_fffffffffffff568;
    if (local_d8[0] != (XMLLoader *)0x0) {
      (*(*(_func_int ***)&(local_d8[0]->path).filename)[3])();
    }
    local_d8[3] = (XMLLoader *)((long)local_d8[3] + 1);
  } while( true );
}

Assistant:

Parms XMLLoader::loadMaterialParms(const Ref<XML>& parms)
  {
    Parms material;
    for (size_t i=0; i<parms->size(); i++) 
    {
      Ref<XML> entry = parms->children[i];
      std::string name = entry->parm("name");
      if      (entry->name == "int"    ) { material.add(name, load<int>  (entry)); }
      else if (entry->name == "int2"   ) { material.add(name, load<Vec2i>(entry)); }
      else if (entry->name == "int3"   ) { material.add(name, load<Vec3i>(entry)); }
      else if (entry->name == "int4"   ) { material.add(name, load<Vec4i>(entry)); }
      else if (entry->name == "float"  ) { material.add(name, load<float>(entry)); }
      else if (entry->name == "float2" ) { material.add(name, load<Vec2f>(entry)); }
      else if (entry->name == "float3" ) { material.add(name, load<Vec3f>(entry)); }
      else if (entry->name == "float4" ) { material.add(name, load<Vec4f>(entry)); }
      else if (entry->name == "texture3d") { material.add(name, loadTextureParm(entry)); }
      else if (entry->name == "param") {
        const std::string type = entry->parm("type");
        if      (type ==  "int"   ) { material.add(name, load<int>  (entry)); }
        else if (type == "int2"   ) { material.add(name, load<Vec2i>(entry)); }
        else if (type == "int3"   ) { material.add(name, load<Vec3i>(entry)); }
        else if (type == "int4"   ) { material.add(name, load<Vec4i>(entry)); }
        else if (type == "float"  ) { material.add(name, load<float>(entry)); }
        else if (type == "float2" ) { material.add(name, load<Vec2f>(entry)); }
        else if (type == "float3" ) { material.add(name, load<Vec3f>(entry)); }
        else if (type == "float4" ) { material.add(name, load<Vec4f>(entry)); }
        else THROW_RUNTIME_ERROR(entry->loc.str()+": invalid param type: "+type);
      }
    }
    return material;
  }